

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::KeyData::DerivePubkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  Privkey *this_00;
  Pubkey *this_01;
  bool bVar1;
  CfdException *this_02;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_03;
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  ByteData fp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  ExtPubkey key;
  
  this_03 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&join_path;
  this_00 = &(this->extprivkey_).privkey_;
  bVar1 = Privkey::IsValid(this_00);
  if (bVar1) {
    ExtPrivkey::DerivePubkey(&key,&this->extprivkey_,path);
    if (!has_rebase_path) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&join_path,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&join_path,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&join_path);
      KeyData(__return_storage_ptr__,&key,&join_path,&this->fingerprint_);
LAB_002cdcb6:
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      goto LAB_002cdcbe;
    }
    Privkey::Privkey((Privkey *)&join_path,this_00);
    Privkey::GeneratePubkey((Pubkey *)&local_b0,(Privkey *)&join_path,true);
    Pubkey::GetFingerprint(&fp,(Pubkey *)&local_b0,4);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&join_path);
    KeyData(__return_storage_ptr__,&key,path,&fp);
    this_03 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fp;
  }
  else {
    this_01 = &(this->extpubkey_).pubkey_;
    bVar1 = Pubkey::IsValid(this_01);
    if (!bVar1) {
      key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
      key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x54a;
      key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "DerivePubkey";
      logger::warn<>((CfdSourceLocation *)&key,"Failed to invalid extPubkey.");
      this_02 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&key,"Failed to invalid extPubkey.",(allocator *)&join_path);
      CfdException::CfdException(this_02,kCfdIllegalStateError,(string *)&key);
      __cxa_throw(this_02,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::DerivePubkey(&key,&this->extpubkey_,path);
    if (!has_rebase_path) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&join_path,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&join_path,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&join_path);
      KeyData(__return_storage_ptr__,&key,&join_path,&this->fingerprint_);
      goto LAB_002cdcb6;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fp,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
    Pubkey::GetFingerprint((ByteData *)&join_path,(Pubkey *)&fp,4);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fp);
    KeyData(__return_storage_ptr__,&key,path,(ByteData *)&join_path);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_03);
LAB_002cdcbe:
  ExtPubkey::~ExtPubkey(&key);
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePubkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (extprivkey_.IsValid()) {
    auto key = extprivkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else if (extpubkey_.IsValid()) {
    auto key = extpubkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extpubkey_.GetPubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPubkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPubkey.");
  }
}